

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O2

int alsa_enumerate_devices
              (cubeb_conflict1 *context,cubeb_device_type type,cubeb_device_collection *collection)

{
  int iVar1;
  undefined8 in_RAX;
  cubeb_device_info *pcVar2;
  int iVar3;
  uint32_t max_channels;
  uint32_t rate;
  
  if (context == (cubeb_conflict1 *)0x0) {
    iVar3 = -1;
  }
  else {
    _max_channels = in_RAX;
    iVar1 = alsa_get_preferred_sample_rate(context,&rate);
    iVar3 = -1;
    if (iVar1 == 0) {
      iVar1 = alsa_get_max_channel_count(context,&max_channels);
      if (iVar1 == 0) {
        pcVar2 = (cubeb_device_info *)calloc(1,0x58);
        if (pcVar2 != (cubeb_device_info *)0x0) {
          pcVar2->device_id = "default";
          pcVar2->devid = "default";
          pcVar2->friendly_name = "default";
          pcVar2->group_id = "default";
          pcVar2->vendor_name = "default";
          pcVar2->type = type;
          pcVar2->state = CUBEB_DEVICE_STATE_ENABLED;
          pcVar2->preferred = CUBEB_DEVICE_PREF_ALL;
          pcVar2->format = CUBEB_DEVICE_FMT_S16LE;
          pcVar2->default_format = CUBEB_DEVICE_FMT_S16LE;
          pcVar2->max_channels = max_channels;
          pcVar2->min_rate = rate;
          pcVar2->max_rate = rate;
          pcVar2->default_rate = rate;
          collection->device = pcVar2;
          collection->count = 1;
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int
alsa_enumerate_devices(cubeb * context, cubeb_device_type type,
                       cubeb_device_collection * collection)
{
  cubeb_device_info* device = NULL;

  if (!context)
    return CUBEB_ERROR;

  uint32_t rate, max_channels;
  int r;

  r = alsa_get_preferred_sample_rate(context, &rate);
  if (r != CUBEB_OK) {
    return CUBEB_ERROR;
  }

  r = alsa_get_max_channel_count(context, &max_channels);
  if (r != CUBEB_OK) {
    return CUBEB_ERROR;
  }

  char const * a_name = "default";
  device = (cubeb_device_info *) calloc(1, sizeof(cubeb_device_info));
  assert(device);
  if (!device)
    return CUBEB_ERROR;

  device->device_id = a_name;
  device->devid = (cubeb_devid) device->device_id;
  device->friendly_name = a_name;
  device->group_id = a_name;
  device->vendor_name = a_name;
  device->type = type;
  device->state = CUBEB_DEVICE_STATE_ENABLED;
  device->preferred = CUBEB_DEVICE_PREF_ALL;
  device->format = CUBEB_DEVICE_FMT_S16NE;
  device->default_format = CUBEB_DEVICE_FMT_S16NE;
  device->max_channels = max_channels;
  device->min_rate = rate;
  device->max_rate = rate;
  device->default_rate = rate;
  device->latency_lo = 0;
  device->latency_hi = 0;

  collection->device = device;
  collection->count = 1;

  return CUBEB_OK;
}